

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O1

int getIDWithAttrMask(uint16_t *instructionID,InternalInstruction *insn,uint16_t attrMask)

{
  InstrUID IVar1;
  int iVar2;
  OpcodeDecision *pOVar3;
  uint8_t modRM;
  uint8_t *puVar4;
  byte opcode;
  InstructionContext insnContext;
  OpcodeType type;
  
  opcode = insn->opcode;
  if (((ulong)opcode == 0xe) && (IVar1 = 0x2fc, insn->opcodeType == T3DNOW_MAP)) goto LAB_001a8021;
  type = insn->opcodeType;
  insnContext = IC_OF;
  if (type != T3DNOW_MAP) {
    insnContext = (InstructionContext)""[attrMask];
  }
  switch(type) {
  case TWOBYTE:
    puVar4 = "\x01\x02\x03\x04";
    pOVar3 = x86DisassemblerTwoByteOpcodes;
    break;
  case THREEBYTE_38:
    puVar4 = "\x01\x02\x03\x04";
    pOVar3 = x86DisassemblerThreeByte38Opcodes;
    break;
  case THREEBYTE_3A:
    puVar4 = "\x01\x02\x03\x04";
    pOVar3 = x86DisassemblerThreeByte3AOpcodes;
    break;
  case XOP8_MAP:
    puVar4 = "";
    pOVar3 = x86DisassemblerXOP8Opcodes;
    break;
  case XOP9_MAP:
    puVar4 = "";
    pOVar3 = x86DisassemblerXOP9Opcodes;
    break;
  case XOPA_MAP:
    puVar4 = "";
    pOVar3 = x86DisassemblerXOPAOpcodes;
    break;
  case T3DNOW_MAP:
    goto switchD_001a7f60_caseD_7;
  default:
    puVar4 = "\x01\x02\x03\x04";
    pOVar3 = x86DisassemblerOneByteOpcodes;
  }
  if ((puVar4[insnContext] == 0) ||
     (pOVar3[puVar4[insnContext] - 1].modRMDecisions[opcode].modrm_type == '\0')) {
    modRM = '\0';
  }
  else {
switchD_001a7f60_caseD_7:
    iVar2 = readModRM(insn);
    if (iVar2 != 0) {
      return -1;
    }
    type = insn->opcodeType;
    opcode = insn->opcode;
    modRM = insn->modRM;
  }
  IVar1 = decode(type,insnContext,opcode,modRM);
LAB_001a8021:
  *instructionID = IVar1;
  return 0;
}

Assistant:

static int getIDWithAttrMask(uint16_t *instructionID,
		struct InternalInstruction *insn,
		uint16_t attrMask)
{
	bool hasModRMExtension;

	InstructionContext instructionClass;

#ifndef CAPSTONE_X86_REDUCE
	// HACK for femms. to be handled properly in next version 3.x
	if (insn->opcode == 0x0e && insn->opcodeType == T3DNOW_MAP) {
		*instructionID = X86_FEMMS;
		return 0;
	}
#endif

	if (insn->opcodeType == T3DNOW_MAP)
		instructionClass = IC_OF;
	else
		instructionClass = contextForAttrs(attrMask);

	hasModRMExtension = modRMRequired(insn->opcodeType,
			instructionClass,
			insn->opcode);

	if (hasModRMExtension) {
		if (readModRM(insn))
			return -1;

		*instructionID = decode(insn->opcodeType,
				instructionClass,
				insn->opcode,
				insn->modRM);
	} else {
		*instructionID = decode(insn->opcodeType,
				instructionClass,
				insn->opcode,
				0);
	}

	return 0;
}